

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O1

void * device_start_nesapu(UINT32 clock,UINT32 rate)

{
  int iVar1;
  nesapu_state *info;
  void *pvVar2;
  uint uVar3;
  int i;
  long lVar4;
  uint uVar5;
  int iVar6;
  
  pvVar2 = calloc(1,0x43f0);
  if (pvVar2 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    *(uint *)((long)pvVar2 + 0xe4) = rate / 0x3c;
    *(uint *)((long)pvVar2 + 0xe8) = rate / 0x3c;
    uVar3 = (rate / 0x3c) * 0x3c;
    *(uint *)((long)pvVar2 + 0xec) = uVar3;
    *(float *)((long)pvVar2 + 0xe0) = (float)clock / (float)uVar3;
    uVar3 = 0x11;
    lVar4 = 0xf0;
    do {
      uVar5 = (int)uVar3 >> 1;
      uVar3 = ((uVar3 ^ uVar5) & 1) << 0xc | uVar5;
      *(char *)((long)pvVar2 + lVar4) = (char)uVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x40f0);
    iVar1 = *(int *)((long)pvVar2 + 0xe4);
    lVar4 = 0;
    do {
      *(uint *)((long)pvVar2 + lVar4 * 4 + 0x40f0) =
           (uint)"\x05\x7f\n\x01\x13\x02(\x03P\x04\x1e\x05\a\x06\r\a\x06\b\f\t\x18\n0\v`\f$\r\b\x0e\x10\x0f"
                 [lVar4] * iVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
    iVar1 = *(int *)((long)pvVar2 + 0xe4);
    lVar4 = 0x105c;
    iVar6 = iVar1;
    do {
      *(int *)((long)pvVar2 + lVar4 * 4) = iVar6;
      lVar4 = lVar4 + 1;
      iVar6 = iVar6 + iVar1;
    } while (lVar4 != 0x107c);
    lVar4 = 0x107c;
    uVar3 = 0;
    do {
      *(uint *)((long)pvVar2 + lVar4 * 4) = uVar3 >> 2;
      lVar4 = lVar4 + 1;
      uVar3 = uVar3 + iVar1;
    } while (lVar4 != 0x10fc);
    *(int *)((long)pvVar2 + 0xe8) = *(int *)((long)pvVar2 + 0xe8) + *(int *)((long)pvVar2 + 0xe4);
    *(undefined8 *)((long)pvVar2 + 0xa0) = 0;
    *(undefined1 *)((long)pvVar2 + 0x27) = 0;
    *(undefined1 *)((long)pvVar2 + 0x47) = 0;
    *(undefined1 *)((long)pvVar2 + 99) = 0;
    *(undefined1 *)((long)pvVar2 + 0x7e) = 0;
    *(undefined1 *)((long)pvVar2 + 0xaa) = 0;
  }
  return pvVar2;
}

Assistant:

void* device_start_nesapu(UINT32 clock, UINT32 rate)
{
	nesapu_state *info;

	info = (nesapu_state*)calloc(1, sizeof(nesapu_state));
	if (info == NULL)
		return NULL;
	
	/* Initialize global variables */
	info->samps_per_sync = rate / SCREEN_HZ;
	info->buffer_size = info->samps_per_sync;
	info->real_rate = info->samps_per_sync * SCREEN_HZ;
	info->apu_incsize = (float) (clock / (float) info->real_rate);

	/* Use initializer calls */
	create_noise(info->noise_lut, 13, NOISE_LONG);
	create_vbltimes(info->vbl_times,vbl_length,info->samps_per_sync);
	create_syncs(info, info->samps_per_sync);

	/* Adjust buffer size if 16 bits */
	info->buffer_size+=info->samps_per_sync;

	info->APU.dpcm.memory = NULL;

	nesapu_set_mute_mask(info, 0x00);

	return info;
}